

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilesystemTest.cc
# Opt level: O2

int main(int param_1,char **param_2)

{
  size_type sVar1;
  bool bVar2;
  __type pred;
  uint uVar3;
  size_type sVar4;
  uint fd;
  int __timeout;
  size_t size;
  string *this;
  string filename;
  string symlink_name;
  string data;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  results;
  __node_base_ptr local_b0;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,".",(allocator<char> *)&symlink_name);
  phosg::list_directory
            ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&results,(string *)&filename);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"FilesystemTest",(allocator<char> *)&symlink_name);
  sVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&results,&filename);
  phosg::expect_generic
            (sVar4 == 1,"1 != results.count(\"FilesystemTest\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x11);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"the-test-will-fail-if-this-file-exists",
             (allocator<char> *)&symlink_name);
  sVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&results,&filename);
  phosg::expect_generic
            (sVar4 == 0,"0 != results.count(\"the-test-will-fail-if-this-file-exists\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x13);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,".",(allocator<char> *)&symlink_name);
  sVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&results,&filename);
  phosg::expect_generic
            (sVar4 == 0,"0 != results.count(\".\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x14);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"..",(allocator<char> *)&symlink_name);
  sVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&results,&filename);
  phosg::expect_generic
            (sVar4 == 0,"0 != results.count(\"..\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x15);
  std::__cxx11::string::~string((string *)&filename);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&results);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"FilesystemTest-data",(allocator<char> *)&results);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&symlink_name,"FilesystemTest-link",(allocator<char> *)&results);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"0123456789",(allocator<char> *)&results);
  phosg::save_file((string *)&filename,(string *)&data);
  phosg::load_file((string *)&results,(string *)&filename);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &results,"0123456789");
  phosg::expect_generic
            (bVar2,"\"0123456789\" != load_file(filename)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x1f);
  std::__cxx11::string::~string((string *)&results);
  sVar1 = data._M_string_length;
  phosg::stat((char *)&results,(stat *)&filename);
  phosg::expect_generic
            ((__node_base_ptr)sVar1 == local_b0,"data.size() != (size_t)stat(filename).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x21);
  sVar1 = data._M_string_length;
  phosg::lstat((char *)&results,(stat *)&filename);
  phosg::expect_generic
            ((__node_base_ptr)sVar1 == local_b0,"data.size() != (size_t)lstat(filename).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x23);
  symlink((char *)CONCAT26(filename._M_dataplus._M_p._6_2_,
                           CONCAT24(filename._M_dataplus._M_p._4_2_,filename._M_dataplus._M_p._0_4_)
                          ),symlink_name._M_dataplus._M_p);
  sVar1 = data._M_string_length;
  phosg::stat((char *)&results,(stat *)&symlink_name);
  phosg::expect_generic
            ((__node_base_ptr)sVar1 == local_b0,"data.size() != (size_t)stat(symlink_name).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x27);
  phosg::lstat((char *)&results,(stat *)&symlink_name);
  phosg::expect_generic
            ((__node_base_ptr)filename._M_string_length == local_b0,
             "filename.size() != (size_t)lstat(symlink_name).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&results,"r+b",(allocator<char> *)&local_50);
  phosg::fopen_unique((phosg *)&f,(string *)&filename,(string *)&results,(FILE *)0x0);
  std::__cxx11::string::~string((string *)&results);
  sVar1 = data._M_string_length;
  phosg::fstat((int)&results,
               (stat *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                       super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                       super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
  phosg::expect_generic
            ((__node_base_ptr)sVar1 == local_b0,"data.size() != (size_t)fstat(f.get()).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x2d);
  sVar1 = data._M_string_length;
  uVar3 = fileno((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                         super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
  phosg::fstat((int)&results,(stat *)(ulong)uVar3);
  phosg::expect_generic
            ((__node_base_ptr)sVar1 == local_b0,
             "data.size() != (size_t)fstat(fileno(f.get())).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x2e);
  fseek((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,5,0);
  fwrite(data._M_dataplus._M_p,1,data._M_string_length,
         (FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                 super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                 super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
  std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr(&f);
  phosg::stat((char *)&results,(stat *)&symlink_name);
  phosg::expect_generic
            ((__node_base_ptr)(data._M_string_length + 5) == local_b0,
             "data.size() + 5 != (size_t)stat(symlink_name).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x34);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,&data,0,5);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&results,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,&data);
  phosg::load_file(&local_50,(string *)&symlink_name);
  pred = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &results,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_50);
  size = 0x35;
  phosg::expect_generic
            (pred,"data.substr(0, 5) + data != load_file(symlink_name)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x35);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&results);
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&data);
  this = &filename;
  remove((char *)CONCAT26(filename._M_dataplus._M_p._6_2_,
                          CONCAT24(filename._M_dataplus._M_p._4_2_,filename._M_dataplus._M_p._0_4_))
        );
  remove(symlink_name._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&symlink_name);
  std::__cxx11::string::~string((string *)this);
  uVar3 = phosg::pipe((int *)this);
  phosg::writex(fd,"omg",3);
  phosg::readx_abi_cxx11_((string *)&results,(phosg *)(ulong)uVar3,3,size);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &results,"omg");
  phosg::expect_generic
            (bVar2,"\"omg\" != readx(p.first, 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x49);
  std::__cxx11::string::~string((string *)&results);
  symlink_name._M_dataplus._M_p = (pointer)0x0;
  symlink_name._M_string_length = 0;
  symlink_name.field_2._M_allocated_capacity = 0;
  phosg::Poll::add((Poll *)&symlink_name,uVar3,1);
  phosg::Poll::add((Poll *)&symlink_name,fd,4);
  filename._M_dataplus._M_p._4_2_ = 4;
  __timeout = 0;
  std::
  _Hashtable<int,std::pair<int_const,short>,std::allocator<std::pair<int_const,short>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<int_const,short>const*>
            ((_Hashtable<int,std::pair<int_const,short>,std::allocator<std::pair<int_const,short>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&results,&filename,&filename._M_string_length,0,&data,&f,&local_50);
  phosg::Poll::poll((Poll *)&filename,(pollfd *)&symlink_name,0,__timeout);
  bVar2 = std::__detail::
          _Equality<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::_M_equal((_Equality<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&results,(__hashtable *)&filename);
  phosg::expect_generic
            (bVar2,"expected_result != poll.poll()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x4f);
  std::
  _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&filename);
  phosg::Poll::remove((Poll *)&symlink_name,(char *)(ulong)uVar3);
  phosg::Poll::remove((Poll *)&symlink_name,(char *)(ulong)fd);
  std::
  _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&results);
  std::_Vector_base<pollfd,_std::allocator<pollfd>_>::~_Vector_base
            ((_Vector_base<pollfd,_std::allocator<pollfd>_> *)&symlink_name);
  puts("FilesystemTest: all tests passed");
  return 0;
}

Assistant:

int main(int, char**) {
  {
    auto results = list_directory(".");
#ifdef PHOSG_WINDOWS
    expect_eq(1, results.count("FilesystemTest.exe"));
#else
    expect_eq(1, results.count("FilesystemTest"));
#endif
    expect_eq(0, results.count("the-test-will-fail-if-this-file-exists"));
    expect_eq(0, results.count("."));
    expect_eq(0, results.count(".."));
  }

  {
    string filename("FilesystemTest-data");
    string symlink_name("FilesystemTest-link");
    try {
      string data("0123456789");

      save_file(filename, data);
      expect_eq("0123456789", load_file(filename));

      expect_eq(data.size(), (size_t)stat(filename).st_size);
#ifndef PHOSG_WINDOWS
      expect_eq(data.size(), (size_t)lstat(filename).st_size);

      symlink(filename.c_str(), symlink_name.c_str());

      expect_eq(data.size(), (size_t)stat(symlink_name).st_size);
      expect_eq(filename.size(), (size_t)lstat(symlink_name).st_size);
#endif

      {
        auto f = fopen_unique(filename, "r+b");
        expect_eq(data.size(), (size_t)fstat(f.get()).st_size);
        expect_eq(data.size(), (size_t)fstat(fileno(f.get())).st_size);
        fseek(f.get(), 5, SEEK_SET);
        fwrite(data.data(), 1, data.size(), f.get());
      }

#ifndef PHOSG_WINDOWS
      expect_eq(data.size() + 5, (size_t)stat(symlink_name).st_size);
      expect_eq(data.substr(0, 5) + data, load_file(symlink_name));
#endif

    } catch (...) {
      remove(filename.c_str());
#ifndef PHOSG_WINDOWS
      remove(symlink_name.c_str());
#endif
      throw;
    }
    remove(filename.c_str());
#ifndef PHOSG_WINDOWS
    remove(symlink_name.c_str());
#endif
  }

#ifndef PHOSG_WINDOWS
  {
    auto p = pipe();
    writex(p.second, "omg", 3);
    expect_eq("omg", readx(p.first, 3));

    Poll poll;
    poll.add(p.first, POLLIN);
    poll.add(p.second, POLLOUT);
    unordered_map<int, short> expected_result({{p.second, POLLOUT}});
    expect_eq(expected_result, poll.poll());
    poll.remove(p.first, true);
    poll.remove(p.second, true);
  }
#endif

  // TODO: test get_user_home_directory

  printf("FilesystemTest: all tests passed\n");
  return 0;
}